

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void change_ssa_edge_list_def
               (ssa_edge_t_conflict list,bb_insn_t_conflict new_bb_insn,uint new_def_op_num,
               MIR_reg_t reg,MIR_reg_t new_reg)

{
  long lVar1;
  MIR_op_t *op_ref;
  ssa_edge_t_conflict se;
  MIR_reg_t new_reg_local;
  MIR_reg_t reg_local;
  uint new_def_op_num_local;
  bb_insn_t_conflict new_bb_insn_local;
  ssa_edge_t_conflict list_local;
  
  op_ref = (MIR_op_t *)list;
  if (new_reg < 0x22) {
    __assert_fail("new_reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x978,
                  "void change_ssa_edge_list_def(ssa_edge_t, bb_insn_t, unsigned int, MIR_reg_t, MIR_reg_t)"
                 );
  }
  do {
    if (op_ref == (MIR_op_t *)0x0) {
      return;
    }
    *(bb_insn_t_conflict *)&op_ref->field_0x8 = new_bb_insn;
    *(short *)((long)&op_ref->u + 2) = (short)new_def_op_num;
    if (new_reg != 0xffffffff) {
      lVar1 = *op_ref->data + 0x20 + (ulong)(op_ref->u).mem.alias * 0x30;
      if ((*(ushort *)(lVar1 + 8) & 0xff) == 2) {
        if (*(MIR_reg_t *)(lVar1 + 0x10) == reg) {
          *(MIR_reg_t *)(lVar1 + 0x10) = new_reg;
        }
      }
      else {
        if ((*(ushort *)(lVar1 + 8) & 0xff) != 0xb) {
          __assert_fail("op_ref->mode == MIR_OP_VAR_MEM",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x981,
                        "void change_ssa_edge_list_def(ssa_edge_t, bb_insn_t, unsigned int, MIR_reg_t, MIR_reg_t)"
                       );
        }
        if (*(MIR_reg_t *)(lVar1 + 0x20) == reg) {
          *(MIR_reg_t *)(lVar1 + 0x20) = new_reg;
        }
        if (*(MIR_reg_t *)(lVar1 + 0x24) == reg) {
          *(MIR_reg_t *)(lVar1 + 0x24) = new_reg;
        }
      }
    }
    op_ref = *(MIR_op_t **)((long)&op_ref->u + 0x10);
  } while( true );
}

Assistant:

static void change_ssa_edge_list_def (ssa_edge_t list, bb_insn_t new_bb_insn,
                                      unsigned new_def_op_num, MIR_reg_t reg, MIR_reg_t new_reg) {
  gen_assert (new_reg > MAX_HARD_REG);
  for (ssa_edge_t se = list; se != NULL; se = se->next_use) {
    se->def = new_bb_insn;
    se->def_op_num = new_def_op_num;
    if (new_reg != MIR_NON_VAR) {
      MIR_op_t *op_ref = &se->use->insn->ops[se->use_op_num];
      if (op_ref->mode == MIR_OP_VAR) {
        if (op_ref->u.var == reg) op_ref->u.var = new_reg;
      } else {
        gen_assert (op_ref->mode == MIR_OP_VAR_MEM);
        if (op_ref->u.var_mem.base == reg) op_ref->u.var_mem.base = new_reg;
        if (op_ref->u.var_mem.index == reg) op_ref->u.var_mem.index = new_reg;
      }
    }
  }
}